

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool tinygltf::detail::
     ForEachInArray<tinygltf::TinyGLTF::LoadFromString(tinygltf::Model*,std::__cxx11::string*,std::__cxx11::string*,char_const*,unsigned_int,std::__cxx11::string_const&,unsigned_int)::__12>
               (json *_v,char *member,anon_class_24_3_07ed8cb9 *cb)

{
  char cVar1;
  string *err;
  bool bVar2;
  reference pbVar3;
  string *psVar4;
  string *err_00;
  json *extraout_RDX;
  json *extraout_RDX_00;
  json *extraout_RDX_01;
  json *extraout_RDX_02;
  json *extraout_RDX_03;
  json *o;
  json *extraout_RDX_04;
  json *extraout_RDX_05;
  json *extraout_RDX_06;
  json *pjVar5;
  json *extraout_RDX_07;
  json *extraout_RDX_08;
  json *extraout_RDX_09;
  json *extraout_RDX_10;
  json *extraout_RDX_11;
  json *extraout_RDX_12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  json_const_iterator it_1;
  int samplerIndex;
  int targetIndex;
  json_const_iterator targetIt;
  json_const_iterator channelsIt;
  json_const_array_iterator channelEnd;
  json_const_array_iterator i;
  AnimationChannel channel;
  json_const_iterator itm;
  json_const_array_iterator it;
  json_const_array_iterator end;
  string local_538;
  string local_510;
  int local_4f0;
  int local_4ec;
  string *local_4e8;
  ExtensionMap *local_4e0;
  json_const_iterator local_4d8;
  json_const_iterator local_4b8;
  char *local_498;
  Value *local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_488;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_480;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_460;
  ExtensionMap *local_440;
  _Base_ptr local_438;
  size_t *local_430;
  undefined1 local_428 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_410;
  Value local_400;
  ExtensionMap local_368;
  undefined1 auStack_338 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  pointer local_2f8;
  pointer pVStack_2f0;
  pointer local_2e8;
  pointer pVStack_2e0;
  _Rb_tree_node_base local_2d0;
  size_t local_2b0;
  bool local_2a8;
  ExtensionMap local_2a0;
  _Alloc_hider local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Alloc_hider local_250;
  size_type local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  _Alloc_hider local_230;
  size_type local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  undefined1 local_1f0 [280];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  json_const_iterator local_98;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_70;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_50;
  
  local_98.m_object = (pointer)0x0;
  local_98.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_98.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        *)0x0;
  local_98.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar2 = FindMember(_v,"animations",&local_98);
  if ((bVar2) &&
     (pbVar3 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_98), pbVar3->m_type == array)) {
    pbVar3 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator*(&local_98);
    local_70.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_70.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_70.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_70.m_object = pbVar3;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_begin(&local_70);
    local_50.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_50.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)0x0;
    local_50.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_50.m_object = pbVar3;
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::set_end(&local_50);
    bVar2 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::
            operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                      (&local_70,&local_50);
    if (!bVar2) {
      local_438 = (_Base_ptr)(local_1f0 + 0xf0);
      local_430 = &local_368._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_490 = (Value *)auStack_338;
      local_440 = (ExtensionMap *)(local_1f0 + 0xe8);
      local_488 = &local_318;
      local_4e0 = &local_368;
      local_498 = member;
      do {
        psVar4 = (string *)
                 nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ::operator*(&local_70);
        if (*(value_t *)&(psVar4->_M_dataplus)._M_p != object) {
          if ((char *)**(undefined8 **)member != (char *)0x0) {
            std::__cxx11::string::append((char *)**(undefined8 **)member);
          }
          return false;
        }
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1f0._80_4_ = 0;
        local_1f0._84_4_ = 0;
        local_1f0._88_8_ = 0.0;
        local_1f0._64_8_ = (pointer)0x0;
        local_1f0._72_8_ = (pointer)0x0;
        local_1f0._48_8_ = (pointer)0x0;
        local_1f0._56_8_ = (pointer)0x0;
        local_1f0._32_8_ = (pointer)0x0;
        local_1f0._40_8_ = (pointer)0x0;
        local_1f0._96_8_ = local_1f0 + 0x70;
        local_1f0._104_8_ = 0;
        local_1f0[0x70] = '\0';
        local_1f0._184_4_ = _S_red;
        local_1f0._192_8_ = (_Base_ptr)0x0;
        local_1f0._160_8_ = (pointer)0x0;
        local_1f0._168_8_ = (pointer)0x0;
        local_1f0._144_8_ = (pointer)0x0;
        local_1f0._152_8_ = (pointer)0x0;
        local_1f0._128_8_ = (pointer)0x0;
        local_1f0._136_8_ = (pointer)0x0;
        local_1f0._200_8_ = local_1f0 + 0xb8;
        local_1f0._216_8_ = 0;
        local_1f0[0xe0] = false;
        local_1f0._240_4_ = _S_red;
        local_1f0._248_8_ = (_Base_ptr)0x0;
        local_1f0._256_8_ = local_438;
        local_1f0._264_8_ = local_438;
        local_1f0._272_8_ = 0;
        local_d8._M_p = (pointer)&local_c8;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_b8._M_p = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        err = (string *)**(undefined8 **)member;
        cVar1 = *(char *)(*(long *)(member + 8) + 0x19);
        local_4b8.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_4b8.m_object = (reference)0x0;
        local_4b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_4b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
        local_4e8 = psVar4;
        local_1f0._208_8_ = local_1f0._200_8_;
        bVar2 = FindMember((json *)psVar4,"channels",&local_4b8);
        if ((bVar2) &&
           (pbVar3 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_4b8), pbVar3->m_type == array)) {
          local_480.m_object =
               nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_4b8);
          local_480.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_480.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_480.m_it.primitive_iterator.m_it = -0x8000000000000000;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::set_end(&local_480);
          local_460.m_object =
               nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ::operator*(&local_4b8);
          local_460.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_460.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_460.m_it.primitive_iterator.m_it = -0x8000000000000000;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::set_begin(&local_460);
          bVar2 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_460,&local_480);
          while (paVar6 = &local_538.field_2, bVar2 == false) {
            local_428._0_8_ = (pointer)0xffffffffffffffff;
            local_428._8_8_ = &local_410;
            local_428._16_8_ = 0;
            local_410._M_allocated_capacity = local_410._M_allocated_capacity & 0xffffffffffffff00;
            local_400.type_ = 0;
            local_400.int_value_ = 0;
            local_400.real_value_ = 0.0;
            local_400.string_value_._M_dataplus._M_p = (pointer)&local_400.string_value_.field_2;
            local_400.string_value_._M_string_length = 0;
            local_400.string_value_.field_2._M_local_buf[0] = '\0';
            local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            local_400.array_value_.
            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_400.array_value_.
            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_400.binary_value_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_400.array_value_.
            super__Vector_base<tinygltf::Value,_std::allocator<tinygltf::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_400.binary_value_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_400.binary_value_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_header;
            local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_400.boolean_value_ = false;
            local_368._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_368._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_368._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_368._M_t._M_impl.super__Rb_tree_header._M_header;
            local_430[2] = 0;
            *local_430 = 0;
            local_430[1] = 0;
            auStack_338._16_8_ = local_488;
            auStack_338._24_8_ = 0;
            local_318._M_local_buf[0] = '\0';
            local_2d0._M_color = _S_red;
            local_2d0._M_parent = (_Base_ptr)0x0;
            local_2e8 = (pointer)0x0;
            pVStack_2e0 = (pointer)0x0;
            local_2f8 = (pointer)0x0;
            pVStack_2f0 = (pointer)0x0;
            local_308._M_allocated_capacity = 0;
            local_308._8_8_ = (pointer)0x0;
            local_2d0._M_left = &local_2d0;
            local_2b0 = 0;
            local_2a8 = false;
            local_2a0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2a0._M_t._M_impl.super__Rb_tree_header._M_header;
            local_2a0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_270._M_p = (pointer)&local_260;
            local_268 = 0;
            local_260._M_local_buf[0] = '\0';
            local_250._M_p = (pointer)&local_240;
            local_248 = 0;
            local_240._M_local_buf[0] = '\0';
            local_230._M_p = (pointer)&local_220;
            local_228 = 0;
            local_220._M_local_buf[0] = '\0';
            local_210._M_p = (pointer)&local_200;
            local_208 = 0;
            local_200._M_local_buf[0] = '\0';
            local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_400.object_value_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_368._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_368._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_2d0._M_right = local_2d0._M_left;
            local_2a0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            psVar4 = (string *)
                     nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_460);
            local_4f0 = -1;
            local_4ec = -1;
            local_538.field_2._M_local_buf[4] = 'l';
            local_538.field_2._M_local_buf[5] = 'e';
            local_538.field_2._M_local_buf[6] = 'r';
            local_538.field_2._M_local_buf[0] = 's';
            local_538.field_2._M_allocated_capacity._1_2_ = 0x6d61;
            local_538.field_2._M_local_buf[3] = 'p';
            local_538._M_string_length = 7;
            local_538.field_2._M_local_buf[7] = '\0';
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            local_4d8.m_object = (pointer)0x10;
            local_538._M_dataplus._M_p = (pointer)paVar6;
            local_510._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_510,(ulong)&local_4d8);
            local_510.field_2._M_allocated_capacity = (size_type)local_4d8.m_object;
            *(undefined8 *)local_510._M_dataplus._M_p = 0x6f6974616d696e41;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 8) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 9) = 'C';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 10) = 'h';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 0xb) = 'a';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 0xc) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 0xd) = 'n';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 0xe) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_510._M_dataplus._M_p + 0xf) = 'l';
            local_510._M_string_length = (size_type)local_4d8.m_object;
            local_510._M_dataplus._M_p[(long)local_4d8.m_object] = '\0';
            bVar2 = ParseIntegerProperty(&local_4f0,err,(json *)psVar4,&local_538,true,&local_510);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != paVar6) {
              operator_delete(local_538._M_dataplus._M_p);
            }
            if (bVar2) {
              local_4d8.m_object = (pointer)0x0;
              local_4d8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
              local_4d8.m_it.array_iterator._M_current =
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x0;
              local_4d8.m_it.primitive_iterator.m_it = -0x8000000000000000;
              bVar2 = FindMember((json *)psVar4,"target",&local_4d8);
              pjVar5 = extraout_RDX;
              if ((bVar2) &&
                 (pbVar3 = nlohmann::detail::
                           iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ::operator*(&local_4d8), pjVar5 = extraout_RDX_00,
                 pbVar3->m_type == object)) {
                err_00 = (string *)
                         nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*(&local_4d8);
                local_538.field_2._M_local_buf[0] = 'n';
                local_538.field_2._M_allocated_capacity._1_2_ = 0x646f;
                local_538.field_2._M_local_buf[3] = 'e';
                local_538._M_string_length = 4;
                local_538.field_2._M_local_buf[4] = '\0';
                local_510._M_string_length = 0;
                local_510.field_2._M_allocated_capacity =
                     local_510.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_538._M_dataplus._M_p = (pointer)paVar6;
                local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                ParseIntegerProperty(&local_4ec,err,(json *)err_00,&local_538,false,&local_510);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_510._M_dataplus._M_p != &local_510.field_2) {
                  operator_delete(local_510._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538._M_dataplus._M_p != &local_538.field_2) {
                  operator_delete(local_538._M_dataplus._M_p);
                }
                local_538.field_2._M_local_buf[0] = 'p';
                local_538.field_2._M_allocated_capacity._1_2_ = 0x7461;
                local_538.field_2._M_local_buf[3] = 'h';
                local_538._M_string_length = 4;
                local_538.field_2._M_local_buf[4] = '\0';
                local_510._M_string_length = 0;
                local_510.field_2._M_allocated_capacity =
                     local_510.field_2._M_allocated_capacity & 0xffffffffffffff00;
                local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
                local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
                bVar2 = ParseStringProperty((string *)(local_428 + 8),err,(json *)err_00,&local_538,
                                            true,&local_510);
                pjVar5 = extraout_RDX_01;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_510._M_dataplus._M_p != &local_510.field_2) {
                  operator_delete(local_510._M_dataplus._M_p);
                  pjVar5 = extraout_RDX_02;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_538._M_dataplus._M_p != &local_538.field_2) {
                  operator_delete(local_538._M_dataplus._M_p);
                  pjVar5 = extraout_RDX_03;
                }
                member = local_498;
                if (!bVar2) {
                  if (err != (string *)0x0) {
                    std::__cxx11::string::append((char *)err);
                  }
                  goto LAB_00119390;
                }
                ParseExtensionsProperty(&local_2a0,err_00,pjVar5);
                member = local_498;
                ParseExtrasProperty(local_490,(json *)err_00);
                if (cVar1 != '\0') {
                  local_538._M_dataplus._M_p = (pointer)0x0;
                  local_538._M_string_length = 0;
                  local_538.field_2._M_local_buf[0] = '\0';
                  local_538.field_2._M_allocated_capacity._1_2_ = 0;
                  local_538.field_2._M_local_buf[3] = '\0';
                  local_538.field_2._M_local_buf[4] = '\0';
                  local_538.field_2._M_local_buf[5] = '\0';
                  local_538.field_2._M_local_buf[6] = '\0';
                  local_538.field_2._M_local_buf[7] = '\0';
                  local_538.field_2._8_5_ = 0;
                  local_538.field_2._M_local_buf[0xd] = '\0';
                  local_538.field_2._14_2_ = 0x8000;
                  bVar2 = FindMember((json *)err_00,"extensions",(json_const_iterator *)&local_538);
                  if (bVar2) {
                    pbVar3 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&local_538);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::dump(&local_510,pbVar3,-1,' ',false,strict);
                    std::__cxx11::string::operator=((string *)&local_210,(string *)&local_510);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p);
                    }
                  }
                  local_538._M_dataplus._M_p = (pointer)0x0;
                  local_538._M_string_length = 0;
                  local_538.field_2._M_local_buf[0] = '\0';
                  local_538.field_2._M_allocated_capacity._1_2_ = 0;
                  local_538.field_2._M_local_buf[3] = '\0';
                  local_538.field_2._M_local_buf[4] = '\0';
                  local_538.field_2._M_local_buf[5] = '\0';
                  local_538.field_2._M_local_buf[6] = '\0';
                  local_538.field_2._M_local_buf[7] = '\0';
                  local_538.field_2._8_5_ = 0;
                  local_538.field_2._M_local_buf[0xd] = '\0';
                  local_538.field_2._14_2_ = 0x8000;
                  bVar2 = FindMember((json *)err_00,"extras",(json_const_iterator *)&local_538);
                  pjVar5 = extraout_RDX_04;
                  if (bVar2) {
                    pbVar3 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&local_538);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::dump(&local_510,pbVar3,-1,' ',false,strict);
                    std::__cxx11::string::operator=((string *)&local_230,(string *)&local_510);
                    pjVar5 = extraout_RDX_05;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p);
                      pjVar5 = extraout_RDX_06;
                    }
                  }
                  goto LAB_001191c6;
                }
                local_428._4_4_ = local_4ec;
                local_428._0_4_ = local_4f0;
                ParseExtensionsProperty(local_4e0,psVar4,o);
                ParseExtrasProperty(&local_400,(json *)psVar4);
              }
              else {
LAB_001191c6:
                local_428._4_4_ = local_4ec;
                local_428._0_4_ = local_4f0;
                ParseExtensionsProperty(local_4e0,psVar4,pjVar5);
                ParseExtrasProperty(&local_400,(json *)psVar4);
                if (cVar1 != '\0') {
                  local_538._M_dataplus._M_p = (pointer)0x0;
                  local_538._M_string_length = 0;
                  local_538.field_2._M_local_buf[0] = '\0';
                  local_538.field_2._M_allocated_capacity._1_2_ = 0;
                  local_538.field_2._M_local_buf[3] = '\0';
                  local_538.field_2._M_local_buf[4] = '\0';
                  local_538.field_2._M_local_buf[5] = '\0';
                  local_538.field_2._M_local_buf[6] = '\0';
                  local_538.field_2._M_local_buf[7] = '\0';
                  local_538.field_2._8_5_ = 0;
                  local_538.field_2._M_local_buf[0xd] = '\0';
                  local_538.field_2._14_2_ = 0x8000;
                  bVar2 = FindMember((json *)psVar4,"extensions",(json_const_iterator *)&local_538);
                  if (bVar2) {
                    pbVar3 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&local_538);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::dump(&local_510,pbVar3,-1,' ',false,strict);
                    std::__cxx11::string::operator=((string *)&local_250,(string *)&local_510);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p);
                    }
                  }
                  local_538._M_dataplus._M_p = (pointer)0x0;
                  local_538._M_string_length = 0;
                  local_538.field_2._M_local_buf[0] = '\0';
                  local_538.field_2._M_allocated_capacity._1_2_ = 0;
                  local_538.field_2._M_local_buf[3] = '\0';
                  local_538.field_2._M_local_buf[4] = '\0';
                  local_538.field_2._M_local_buf[5] = '\0';
                  local_538.field_2._M_local_buf[6] = '\0';
                  local_538.field_2._M_local_buf[7] = '\0';
                  local_538.field_2._8_5_ = 0;
                  local_538.field_2._M_local_buf[0xd] = '\0';
                  local_538.field_2._14_2_ = 0x8000;
                  bVar2 = FindMember((json *)psVar4,"extras",(json_const_iterator *)&local_538);
                  if (bVar2) {
                    pbVar3 = nlohmann::detail::
                             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                          *)&local_538);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::dump(&local_510,pbVar3,-1,' ',false,strict);
                    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_510);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_510._M_dataplus._M_p != &local_510.field_2) {
                      operator_delete(local_510._M_dataplus._M_p);
                    }
                  }
                }
              }
              std::vector<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>::
              emplace_back<tinygltf::AnimationChannel>
                        ((vector<tinygltf::AnimationChannel,_std::allocator<tinygltf::AnimationChannel>_>
                          *)(local_1f0 + 0x20),(AnimationChannel *)local_428);
            }
            else if (err != (string *)0x0) {
              std::__cxx11::string::append((char *)err);
            }
LAB_00119390:
            AnimationChannel::~AnimationChannel((AnimationChannel *)local_428);
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&local_460);
            bVar2 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::
                    operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                              (&local_460,&local_480);
          }
        }
        local_4d8.m_object = (pointer)0x0;
        local_4d8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
        local_4d8.m_it.array_iterator._M_current =
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_4d8.m_it.primitive_iterator.m_it = -0x8000000000000000;
        bVar2 = FindMember((json *)local_4e8,"samplers",&local_4d8);
        if ((bVar2) &&
           (pbVar3 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_4d8), pbVar3->m_type == array)) {
          pbVar3 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ::operator*(&local_4d8);
          local_4b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_4b8.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_4b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
          local_4b8.m_object = pbVar3;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::set_begin(&local_4b8);
          local_480.m_it.object_iterator._M_node = (_Base_ptr)0x0;
          local_480.m_it.array_iterator._M_current =
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0;
          local_480.m_it.primitive_iterator.m_it = -0x8000000000000000;
          local_480.m_object = pbVar3;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::set_end(&local_480);
          bVar2 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::
                  operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                            (&local_4b8,&local_480);
          while (bVar2 == false) {
            psVar4 = (string *)
                     nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*(&local_4b8);
            AnimationSampler::AnimationSampler((AnimationSampler *)local_428);
            local_460.m_object = (pointer)CONCAT44(local_460.m_object._4_4_,0xffffffff);
            local_4f0 = -1;
            local_538.field_2._M_local_buf[4] = 't';
            local_538.field_2._M_local_buf[0] = 'i';
            local_538.field_2._M_allocated_capacity._1_2_ = 0x706e;
            local_538.field_2._M_local_buf[3] = 'u';
            local_538._M_string_length = 5;
            local_538.field_2._M_local_buf[5] = '\0';
            local_510._M_string_length = 0;
            local_510.field_2._M_allocated_capacity =
                 local_510.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            bVar2 = ParseIntegerProperty
                              ((int *)&local_460,err,(json *)psVar4,&local_538,true,&local_510);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p);
            }
            if (!bVar2) {
joined_r0x00119a3c:
              if (err != (string *)0x0) {
                std::__cxx11::string::append((char *)err);
              }
              AnimationSampler::~AnimationSampler((AnimationSampler *)local_428);
              Animation::~Animation((Animation *)local_1f0);
              return false;
            }
            local_538.field_2._8_5_ = 0x6e6f697461;
            local_538.field_2._M_local_buf[0] = 'i';
            local_538.field_2._M_allocated_capacity._1_2_ = 0x746e;
            local_538.field_2._M_local_buf[3] = 'e';
            local_538.field_2._M_local_buf[4] = 'r';
            local_538.field_2._M_local_buf[5] = 'p';
            local_538.field_2._M_local_buf[6] = 'o';
            local_538.field_2._M_local_buf[7] = 'l';
            local_538._M_string_length = 0xd;
            local_538.field_2._M_local_buf[0xd] = '\0';
            local_510._M_string_length = 0;
            local_510.field_2._M_allocated_capacity =
                 local_510.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            ParseStringProperty((string *)(local_428 + 8),err,(json *)psVar4,&local_538,false,
                                &local_510);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p);
            }
            local_538.field_2._M_local_buf[4] = 'u';
            local_538.field_2._M_local_buf[5] = 't';
            local_538.field_2._M_local_buf[0] = 'o';
            local_538.field_2._M_allocated_capacity._1_2_ = 0x7475;
            local_538.field_2._M_local_buf[3] = 'p';
            local_538._M_string_length = 6;
            local_538.field_2._M_local_buf[6] = '\0';
            local_510._M_string_length = 0;
            local_510.field_2._M_allocated_capacity =
                 local_510.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
            local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
            bVar2 = ParseIntegerProperty(&local_4f0,err,(json *)psVar4,&local_538,true,&local_510);
            pjVar5 = extraout_RDX_07;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_510._M_dataplus._M_p != &local_510.field_2) {
              operator_delete(local_510._M_dataplus._M_p);
              pjVar5 = extraout_RDX_08;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != &local_538.field_2) {
              operator_delete(local_538._M_dataplus._M_p);
              pjVar5 = extraout_RDX_09;
            }
            if (!bVar2) goto joined_r0x00119a3c;
            local_428._0_8_ = CONCAT44(local_4f0,(int)local_460.m_object);
            ParseExtensionsProperty(local_4e0,psVar4,pjVar5);
            ParseExtrasProperty(&local_400,(json *)psVar4);
            if (cVar1 != '\0') {
              local_538._M_dataplus._M_p = (pointer)0x0;
              local_538._M_string_length = 0;
              local_538.field_2._M_local_buf[0] = '\0';
              local_538.field_2._M_allocated_capacity._1_2_ = 0;
              local_538.field_2._M_local_buf[3] = '\0';
              local_538.field_2._M_local_buf[4] = '\0';
              local_538.field_2._M_local_buf[5] = '\0';
              local_538.field_2._M_local_buf[6] = '\0';
              local_538.field_2._M_local_buf[7] = '\0';
              local_538.field_2._8_5_ = 0;
              local_538.field_2._M_local_buf[0xd] = '\0';
              local_538.field_2._14_2_ = 0x8000;
              bVar2 = FindMember((json *)psVar4,"extensions",(json_const_iterator *)&local_538);
              if (bVar2) {
                pbVar3 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_538);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::dump(&local_510,pbVar3,-1,' ',false,strict);
                std::__cxx11::string::operator=
                          ((string *)local_488->_M_local_buf,(string *)&local_510);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_510._M_dataplus._M_p != &local_510.field_2) {
                  operator_delete(local_510._M_dataplus._M_p);
                }
              }
              local_538._M_dataplus._M_p = (pointer)0x0;
              local_538._M_string_length = 0;
              local_538.field_2._M_local_buf[0] = '\0';
              local_538.field_2._M_allocated_capacity._1_2_ = 0;
              local_538.field_2._M_local_buf[3] = '\0';
              local_538.field_2._M_local_buf[4] = '\0';
              local_538.field_2._M_local_buf[5] = '\0';
              local_538.field_2._M_local_buf[6] = '\0';
              local_538.field_2._M_local_buf[7] = '\0';
              local_538.field_2._8_5_ = 0;
              local_538.field_2._M_local_buf[0xd] = '\0';
              local_538.field_2._14_2_ = 0x8000;
              bVar2 = FindMember((json *)psVar4,"extras",(json_const_iterator *)&local_538);
              if (bVar2) {
                pbVar3 = nlohmann::detail::
                         iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                      *)&local_538);
                nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::dump(&local_510,pbVar3,-1,' ',false,strict);
                std::__cxx11::string::operator=((string *)local_490,(string *)&local_510);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_510._M_dataplus._M_p != &local_510.field_2) {
                  operator_delete(local_510._M_dataplus._M_p);
                }
              }
            }
            std::vector<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>::
            emplace_back<tinygltf::AnimationSampler>
                      ((vector<tinygltf::AnimationSampler,_std::allocator<tinygltf::AnimationSampler>_>
                        *)(local_1f0 + 0x38),(AnimationSampler *)local_428);
            AnimationSampler::~AnimationSampler((AnimationSampler *)local_428);
            nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator++(&local_4b8);
            bVar2 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::
                    operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                              (&local_4b8,&local_480);
          }
        }
        psVar4 = local_4e8;
        paVar6 = &local_538.field_2;
        local_428._0_8_ = local_428 + 0x10;
        local_428._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x4;
        local_428._16_5_ = 0x656d616e;
        local_538._M_string_length = 0;
        local_538.field_2._M_local_buf[0] = '\0';
        local_538._M_dataplus._M_p = (pointer)paVar6;
        ParseStringProperty((string *)local_1f0,err,(json *)local_4e8,(string *)local_428,false,
                            &local_538);
        pjVar5 = extraout_RDX_10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != paVar6) {
          operator_delete(local_538._M_dataplus._M_p);
          pjVar5 = extraout_RDX_11;
        }
        if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
          operator_delete((void *)local_428._0_8_);
          pjVar5 = extraout_RDX_12;
        }
        ParseExtensionsProperty(local_440,psVar4,pjVar5);
        ParseExtrasProperty((Value *)(local_1f0 + 0x50),(json *)local_4e8);
        if (cVar1 != '\0') {
          local_428._0_8_ = (pointer)0x0;
          local_428._8_8_ = (_Base_ptr)0x0;
          local_428._16_8_ = 0;
          local_410._M_allocated_capacity = 0x8000000000000000;
          bVar2 = FindMember((json *)local_4e8,"extensions",(json_const_iterator *)local_428);
          if (bVar2) {
            pbVar3 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_428);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_538,pbVar3,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_538);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != paVar6) {
              operator_delete(local_538._M_dataplus._M_p);
            }
          }
          local_428._0_8_ = (pointer)0x0;
          local_428._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_428._16_8_ = 0;
          local_410._M_allocated_capacity = 0x8000000000000000;
          bVar2 = FindMember((json *)local_4e8,"extras",(json_const_iterator *)local_428);
          if (bVar2) {
            pbVar3 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_428);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::dump(&local_538,pbVar3,-1,' ',false,strict);
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_538);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_538._M_dataplus._M_p != paVar6) {
              operator_delete(local_538._M_dataplus._M_p);
            }
          }
        }
        std::vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>::
        emplace_back<tinygltf::Animation>
                  ((vector<tinygltf::Animation,_std::allocator<tinygltf::Animation>_> *)
                   (**(long **)(member + 0x10) + 0x18),(Animation *)local_1f0);
        Animation::~Animation((Animation *)local_1f0);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++(&local_70);
        bVar2 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::
                operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                          (&local_70,&local_50);
      } while (!bVar2);
    }
  }
  return true;
}

Assistant:

bool ForEachInArray(const detail::json &_v, const char *member, Callback &&cb) {
  detail::json_const_iterator itm;
  if (detail::FindMember(_v, member, itm) &&
      detail::IsArray(detail::GetValue(itm))) {
    const detail::json &root = detail::GetValue(itm);
    auto it = detail::ArrayBegin(root);
    auto end = detail::ArrayEnd(root);
    for (; it != end; ++it) {
      if (!cb(*it)) return false;
    }
  }
  return true;
}